

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::ScalarReplacementPass::ReplaceAccessChain
          (ScalarReplacementPass *this,Instruction *chain,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  pointer pOVar1;
  Op op;
  IRContext *pIVar2;
  pointer ppIVar3;
  undefined8 uVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  Instruction *pIVar8;
  Constant *this_00;
  int64_t iVar9;
  Operand *pOVar10;
  BasicBlock *pBVar11;
  mapped_type *ppBVar12;
  uint uVar13;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  replacementChain;
  Operand copy;
  iterator chainIter;
  iterator iter;
  undefined1 local_b8 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_90;
  IRContext *local_88;
  Instruction *local_80;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_78;
  undefined1 local_70 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  
  uVar13 = (chain->has_result_id_ & 1) + 1;
  if (chain->has_type_id_ == false) {
    uVar13 = (uint)chain->has_result_id_;
  }
  uVar6 = Instruction::GetSingleWordOperand(chain,uVar13 + 1);
  pIVar2 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar2);
  }
  pIVar8 = analysis::DefUseManager::GetDef
                     ((pIVar2->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,uVar6);
  pIVar2 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar2->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
    IRContext::BuildConstantManager(pIVar2);
  }
  this_00 = analysis::ConstantManager::GetConstantFromInst
                      ((pIVar2->constant_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
                       _M_head_impl,pIVar8);
  iVar9 = analysis::Constant::GetSignExtendedValue(this_00);
  if ((iVar9 < 0) ||
     (ppIVar3 = (replacements->
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                )._M_impl.super__Vector_impl_data._M_start,
     (long)(replacements->
           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           )._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar3 >> 3 <= iVar9)) {
LAB_0053a1f8:
    bVar5 = false;
  }
  else {
    pIVar8 = ppIVar3[iVar9];
    bVar5 = chain->has_result_id_;
    uVar13 = (bVar5 & 1) + 1;
    if (chain->has_type_id_ == false) {
      uVar13 = (uint)bVar5;
    }
    if ((int)((ulong)((long)(chain->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(chain->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar13 <
        3) {
      pIVar2 = (this->super_MemPass).super_Pass.context_;
      uVar7 = 0;
      uVar6 = 0;
      if ((bVar5 & 1U) != 0) {
        uVar6 = Instruction::GetSingleWordOperand(chain,(uint)chain->has_type_id_);
      }
      if (pIVar8->has_result_id_ == true) {
        uVar7 = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_);
      }
      IRContext::ReplaceAllUsesWith(pIVar2,uVar6,uVar7);
    }
    else {
      local_78._M_head_impl = chain;
      uVar6 = Pass::TakeNextId((Pass *)this);
      if (uVar6 == 0) goto LAB_0053a1f8;
      local_80 = (Instruction *)operator_new(0x70);
      local_88 = (this->super_MemPass).super_Pass.context_;
      op = chain->opcode_;
      local_70[0x10] = '\0';
      local_70[0x11] = '\0';
      local_70[0x12] = '\0';
      local_70[0x13] = '\0';
      uVar7 = 0;
      if (chain->has_type_id_ == true) {
        uVar7 = Instruction::GetSingleWordOperand(chain,0);
      }
      if (pIVar8->has_result_id_ == true) {
        local_70._16_4_ = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_);
      }
      local_70._24_8_ = local_70 + 0x10;
      local_70._0_8_ = &PTR__SmallVector_009488e0;
      local_50._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      local_70._8_8_ = 1;
      local_b8._0_4_ = SPV_OPERAND_TYPE_ID;
      local_b8._8_8_ = &PTR__SmallVector_009488e0;
      local_b8._16_8_ = 0;
      local_b8._32_8_ = local_b8 + 0x18;
      local_90._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)(local_b8 + 8),
                 (SmallVector<unsigned_int,_2UL> *)local_70);
      local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
      pOVar1 = local_48.
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start + 1;
      (local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
       _M_impl.super__Vector_impl_data._M_start)->type = local_b8._0_4_;
      ((local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_start)->words)._vptr_SmallVector =
           (_func_int **)&PTR__SmallVector_009488e0;
      ((local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_start)->words).size_ = 0;
      ((local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_start)->words).small_data_ =
           (uint *)((local_48.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start)->words).buffer;
      ((local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_start)->words).large_data_._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar1;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                (&(local_48.
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start)->words,
                 (SmallVector<unsigned_int,_2UL> *)(local_b8 + 8));
      pIVar8 = local_80;
      local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_finish = pOVar1;
      Instruction::Instruction(local_80,local_88,op,uVar7,uVar6,&local_48);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                (&local_48);
      local_b8._8_8_ = &PTR__SmallVector_009488e0;
      if (local_90._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_90,local_90._M_head_impl);
      }
      local_90._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_70._0_8_ = &PTR__SmallVector_009488e0;
      if (local_50._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl !=
          (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_50,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   local_50._M_t.
                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   ._M_head_impl);
      }
      uVar13 = (chain->has_result_id_ & 1) + 1;
      if (chain->has_type_id_ == false) {
        uVar13 = (uint)chain->has_result_id_;
      }
      if (2 < (int)((ulong)((long)(chain->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(chain->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
              uVar13) {
        uVar7 = 2;
        do {
          pOVar10 = Instruction::GetInOperand(chain,uVar7);
          local_b8._0_4_ = pOVar10->type;
          local_b8._8_8_ = &PTR__SmallVector_009488e0;
          local_b8._16_8_ = 0;
          local_b8._32_8_ = local_b8 + 0x18;
          local_90._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)(local_b8 + 8),&pOVar10->words);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
          emplace_back<spvtools::opt::Operand>(&pIVar8->operands_,(Operand *)local_b8);
          local_b8._8_8_ = &PTR__SmallVector_009488e0;
          if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )local_90._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
          {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_90,local_90._M_head_impl);
          }
          uVar7 = uVar7 + 1;
          uVar13 = (chain->has_result_id_ & 1) + 1;
          if (chain->has_type_id_ == false) {
            uVar13 = (uint)chain->has_result_id_;
          }
        } while (uVar7 < (int)((ulong)((long)(chain->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(chain->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                         -0x55555555 - uVar13);
      }
      Instruction::UpdateDebugInfoFrom(pIVar8,chain);
      InstructionList::iterator::InsertBefore
                ((iterator *)local_70,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)&local_78);
      pIVar2 = (this->super_MemPass).super_Pass.context_;
      if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar2);
      }
      analysis::DefUseManager::AnalyzeInstDefUse
                ((pIVar2->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,(Instruction *)local_70._0_8_);
      uVar4 = local_70._0_8_;
      pIVar2 = (this->super_MemPass).super_Pass.context_;
      pBVar11 = IRContext::get_instr_block(pIVar2,chain);
      local_b8._0_8_ = uVar4;
      if ((pIVar2->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
        ppBVar12 = std::__detail::
                   _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&pIVar2->instr_to_block_,(key_type *)local_b8);
        *ppBVar12 = pBVar11;
      }
      pIVar2 = (this->super_MemPass).super_Pass.context_;
      uVar7 = 0;
      if (chain->has_result_id_ == true) {
        uVar7 = Instruction::GetSingleWordOperand(chain,(uint)chain->has_type_id_);
      }
      IRContext::ReplaceAllUsesWith(pIVar2,uVar7,uVar6);
      if (pIVar8 != (Instruction *)0x0) {
        (*(pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])
                  ();
      }
    }
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool ScalarReplacementPass::ReplaceAccessChain(
    Instruction* chain, const std::vector<Instruction*>& replacements) {
  // Replaces the access chain with either another access chain (with one fewer
  // indexes) or a direct use of the replacement variable.
  uint32_t indexId = chain->GetSingleWordInOperand(1u);
  const Instruction* index = get_def_use_mgr()->GetDef(indexId);
  int64_t indexValue = context()
                           ->get_constant_mgr()
                           ->GetConstantFromInst(index)
                           ->GetSignExtendedValue();
  if (indexValue < 0 ||
      indexValue >= static_cast<int64_t>(replacements.size())) {
    // Out of bounds access, this is illegal IR.  Notice that OpAccessChain
    // indexing is 0-based, so we should also reject index == size-of-array.
    return false;
  } else {
    const Instruction* var = replacements[static_cast<size_t>(indexValue)];
    if (chain->NumInOperands() > 2) {
      // Replace input access chain with another access chain.
      BasicBlock::iterator chainIter(chain);
      uint32_t replacementId = TakeNextId();
      if (replacementId == 0) {
        return false;
      }
      std::unique_ptr<Instruction> replacementChain(new Instruction(
          context(), chain->opcode(), chain->type_id(), replacementId,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {var->result_id()}}}));
      // Add the remaining indexes.
      for (uint32_t i = 2; i < chain->NumInOperands(); ++i) {
        Operand copy(chain->GetInOperand(i));
        replacementChain->AddOperand(std::move(copy));
      }
      replacementChain->UpdateDebugInfoFrom(chain);
      auto iter = chainIter.InsertBefore(std::move(replacementChain));
      get_def_use_mgr()->AnalyzeInstDefUse(&*iter);
      context()->set_instr_block(&*iter, context()->get_instr_block(chain));
      context()->ReplaceAllUsesWith(chain->result_id(), replacementId);
    } else {
      // Replace with a use of the variable.
      context()->ReplaceAllUsesWith(chain->result_id(), var->result_id());
    }
  }

  return true;
}